

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O2

bool __thiscall axl::cry::BigNum::create(BigNum *this)

{
  bool bVar1;
  BIGNUM *pBVar2;
  int in_ESI;
  
  sl::Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>::close
            (&this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>,
             in_ESI);
  pBVar2 = BN_new();
  (this->super_Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>).m_h =
       (bignum_st *)pBVar2;
  bVar1 = completeWithLastCryptoError((uint)(pBVar2 != (BIGNUM *)0x0));
  return bVar1;
}

Assistant:

bool
BigNum::create() {
	close();

	m_h = BN_new();
	return completeWithLastCryptoError(m_h != NULL);
}